

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O1

float __thiscall nv::FloatImage::sampleNearest(FloatImage *this,float x,float y,int c,WrapMode wm)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  
  if (wm == WrapMode_Repeat) {
    fVar7 = floorf(x);
    uVar1 = this->m_width;
    fVar6 = floorf(y);
    fVar7 = this->m_mem
            [(c * (uint)this->m_height + (int)((float)this->m_height * (y - fVar6))) * (uint)uVar1 +
             (int)((float)uVar1 * (x - fVar7))];
  }
  else {
    if (wm != WrapMode_Clamp) {
      fVar7 = sampleNearestMirror(this,x,y,c);
      return fVar7;
    }
    uVar1 = this->m_width;
    iVar3 = (int)((float)uVar1 * x);
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    if ((int)(uVar1 - 1) < iVar3) {
      iVar3 = uVar1 - 1;
    }
    uVar2 = this->m_height;
    iVar5 = (int)((float)uVar2 * y);
    iVar4 = 0;
    if (0 < iVar5) {
      iVar4 = iVar5;
    }
    if ((int)(uVar2 - 1) < iVar4) {
      iVar4 = uVar2 - 1;
    }
    fVar7 = this->m_mem[(c * (uint)uVar2 + iVar4) * (uint)uVar1 + iVar3];
  }
  return fVar7;
}

Assistant:

float FloatImage::sampleNearest(const float x, const float y, const int c, const WrapMode wm) const
{
	if( wm == WrapMode_Clamp ) return sampleNearestClamp(x, y, c);
	else if( wm == WrapMode_Repeat ) return sampleNearestRepeat(x, y, c);
	else /*if( wm == WrapMode_Mirror )*/ return sampleNearestMirror(x, y, c);
}